

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_log.cxx
# Opt level: O1

void xray_re::die(char *message,char *file,uint line)

{
  int iVar1;
  
  if (xr_log::instance()::instance0 == '\0') {
    iVar1 = __cxa_guard_acquire(&xr_log::instance()::instance0);
    if (iVar1 != 0) {
      xr_log::instance()::instance0._1024_8_ = 0x3ff;
      xr_log::instance()::instance0._1032_8_ = xr_log::instance()::instance0;
      xr_log::instance()::instance0._1040_8_ = 0;
      __cxa_atexit(xr_log::~xr_log,xr_log::instance()::instance0,&__dso_handle);
      __cxa_guard_release(&xr_log::instance()::instance0);
    }
  }
  xr_log::diagnostic((xr_log *)xr_log::instance()::instance0,"[bug] %s at %s:%u",message,file,
                     (ulong)line);
  abort();
}

Assistant:

void xray_re::die(const char* message, const char* file, unsigned line)
{
	xr_log::instance().fatal(message, file, line);
}